

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void reset_rate_conversion_params(EOPLL *opll)

{
  int32_t *piVar1;
  double __x;
  double dVar2;
  EOPLL_RateConv *pEVar3;
  long lVar4;
  double f_out;
  
  f_out = (double)opll->rate;
  __x = (double)opll->clk / 72.0;
  opll->out_time = 0.0;
  opll->out_step = __x;
  opll->inp_step = f_out;
  if (opll->conv != (EOPLL_RateConv *)0x0) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = (EOPLL_RateConv *)0x0;
  }
  dVar2 = floor(__x);
  if ((dVar2 != f_out) || (NAN(dVar2) || NAN(f_out))) {
    dVar2 = floor(__x + 0.5);
    if ((dVar2 != f_out) || (NAN(dVar2) || NAN(f_out))) {
      pEVar3 = EOPLL_RateConv_new(__x,f_out,2);
      opll->conv = pEVar3;
      if (pEVar3 == (EOPLL_RateConv *)0x0) {
        return;
      }
      pEVar3->timer = 0.0;
      if (pEVar3->ch < 1) {
        return;
      }
      lVar4 = 0;
      do {
        piVar1 = pEVar3->buf[lVar4];
        piVar1[0xc] = 0;
        piVar1[0xd] = 0;
        piVar1[0xe] = 0;
        piVar1[0xf] = 0;
        piVar1[8] = 0;
        piVar1[9] = 0;
        piVar1[10] = 0;
        piVar1[0xb] = 0;
        piVar1[4] = 0;
        piVar1[5] = 0;
        piVar1[6] = 0;
        piVar1[7] = 0;
        piVar1[0] = 0;
        piVar1[1] = 0;
        piVar1[2] = 0;
        piVar1[3] = 0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pEVar3->ch);
      return;
    }
  }
  opll->inp_step = opll->out_step;
  return;
}

Assistant:

static void reset_rate_conversion_params(EOPLL *opll) {
  const double f_out = opll->rate;
  const double f_inp = opll->clk / 72.0;

  opll->out_time = 0;
  opll->out_step = f_inp;
  opll->inp_step = f_out;

  if (opll->conv) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = NULL;
  }

  if (floor(f_inp) != f_out && floor(f_inp + 0.5) != f_out) {
    opll->conv = EOPLL_RateConv_new(f_inp, f_out, 2);
  } else {
    opll->inp_step = opll->out_step;
  }

  if (opll->conv) {
    EOPLL_RateConv_reset(opll->conv);
  }
}